

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_string_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  JSAtom atom;
  JSString *p1;
  JSValue JVar1;
  JSValue obj;
  
  if (argc == 0) {
    JVar1 = JS_AtomToString(ctx,0x2f);
  }
  else {
    if ((argv->tag & 0xffffffffU) == 0xfffffff8 && (new_target.tag & 0xffffffffU) == 3) {
      atom = js_get_atom_index(ctx->rt,(JSAtomStruct *)(argv->u).ptr);
      JVar1 = JS_AtomToString(ctx,atom);
      JVar1 = JS_ConcatString3(ctx,"Symbol(",JVar1,")");
    }
    else {
      JVar1.tag = argv->tag;
      JVar1.u.ptr = (argv->u).ptr;
      JVar1 = JS_ToString(ctx,JVar1);
    }
    if ((int)JVar1.tag == 6) {
      return JVar1;
    }
  }
  obj = JVar1;
  if (((int)new_target.tag != 3) && (obj = js_create_from_ctor(ctx,new_target,5), (int)obj.tag != 6)
     ) {
    JS_SetObjectData(ctx,obj,JVar1);
    JS_DefinePropertyValue
              (ctx,obj,0x30,
               (JSValue)ZEXT416((uint)*(undefined8 *)((long)JVar1.u.ptr + 4) & 0x7fffffff),0);
  }
  return obj;
}

Assistant:

static JSValue js_string_constructor(JSContext *ctx, JSValueConst new_target,
                                     int argc, JSValueConst *argv)
{
    JSValue val, obj;
    if (argc == 0) {
        val = JS_AtomToString(ctx, JS_ATOM_empty_string);
    } else {
        if (JS_IsUndefined(new_target) && JS_IsSymbol(argv[0])) {
            JSAtomStruct *p = JS_VALUE_GET_PTR(argv[0]);
            val = JS_ConcatString3(ctx, "Symbol(", JS_AtomToString(ctx, js_get_atom_index(ctx->rt, p)), ")");
        } else {
            val = JS_ToString(ctx, argv[0]);
        }
        if (JS_IsException(val))
            return val;
    }
    if (!JS_IsUndefined(new_target)) {
        JSString *p1 = JS_VALUE_GET_STRING(val);

        obj = js_create_from_ctor(ctx, new_target, JS_CLASS_STRING);
        if (!JS_IsException(obj)) {
            JS_SetObjectData(ctx, obj, val);
            JS_DefinePropertyValue(ctx, obj, JS_ATOM_length, JS_NewInt32(ctx, p1->len), 0);
        }
        return obj;
    } else {
        return val;
    }
}